

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O0

pboolean p_socket_connect(PSocket *socket,PSocketAddress *address,PError **error)

{
  pboolean pVar1;
  int iVar2;
  PErrorIO code;
  psize pVar3;
  PErrorIO sock_err;
  pint conn_result;
  pint err_code;
  sockaddr_storage buffer;
  PError **error_local;
  PSocketAddress *address_local;
  PSocket *socket_local;
  
  buffer.__ss_align = (unsigned_long)error;
  if (socket == (PSocket *)0x0 || address == (PSocketAddress *)0x0) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
    socket_local._4_4_ = 0;
  }
  else {
    pVar1 = pp_socket_check(socket,error);
    if (pVar1 == 0) {
      socket_local._4_4_ = 0;
    }
    else {
      pVar1 = p_socket_address_to_native(address,&conn_result,0x80);
      if (pVar1 == 0) {
        p_error_set_error_p((PError **)buffer.__ss_align,0x20a,0,
                            "Failed to convert socket address to native structure");
        socket_local._4_4_ = 0;
      }
      else {
        do {
          iVar2 = socket->fd;
          pVar3 = p_socket_address_get_native_size(address);
          iVar2 = connect(iVar2,(sockaddr *)&conn_result,(socklen_t)pVar3);
          if (iVar2 == 0) break;
          sock_err = p_error_get_last_net();
        } while (sock_err == 4);
        if (iVar2 == 0) {
          socket->field_0x18 = socket->field_0x18 & 0xf7 | 8;
          socket_local._4_4_ = 1;
        }
        else {
          code = p_error_get_io_from_system(sock_err);
          if (code == P_ERROR_IO_WOULD_BLOCK || code == P_ERROR_IO_IN_PROGRESS) {
            if ((socket->field_0x18 & 1) == 0) {
              p_error_set_error_p((PError **)buffer.__ss_align,code,sock_err,
                                  "Couldn\'t block non-blocking socket");
            }
            else {
              pVar1 = p_socket_io_condition_wait
                                (socket,P_SOCKET_IO_CONDITION_POLLOUT,(PError **)buffer.__ss_align);
              if ((pVar1 == 1) &&
                 (pVar1 = p_socket_check_connect_result(socket,(PError **)buffer.__ss_align),
                 pVar1 == 1)) {
                socket->field_0x18 = socket->field_0x18 & 0xf7 | 8;
                return 1;
              }
            }
          }
          else {
            p_error_set_error_p((PError **)buffer.__ss_align,code,sock_err,
                                "Failed to call connect() on socket");
          }
          socket_local._4_4_ = 0;
        }
      }
    }
  }
  return socket_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_socket_connect (PSocket		*socket,
		  PSocketAddress	*address,
		  PError		**error)
{
	struct sockaddr_storage	buffer;
	pint			err_code;
	pint			conn_result;
	PErrorIO		sock_err;

	if (P_UNLIKELY (socket == NULL || address == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	if (P_UNLIKELY (p_socket_address_to_native (address, &buffer, sizeof (buffer)) == FALSE)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     0,
				     "Failed to convert socket address to native structure");
		return FALSE;
	}

#if !defined (P_OS_WIN) && defined (EINTR)
	for (;;) {
		conn_result = connect (socket->fd, (struct sockaddr *) &buffer,
				       (socklen_t) p_socket_address_get_native_size (address));

		if (P_LIKELY (conn_result == 0))
			break;

		err_code = p_error_get_last_net ();

		if (err_code == EINTR)
			continue;
		else
			break;
	}
#else
	conn_result = connect (socket->fd, (struct sockaddr *) &buffer,
			       (pint) p_socket_address_get_native_size (address));

	if (conn_result != 0)
		err_code = p_error_get_last_net ();
#endif

	if (conn_result == 0) {
		socket->connected = TRUE;
		return TRUE;
	}

	sock_err = p_error_get_io_from_system (err_code);

	if (P_LIKELY (sock_err == P_ERROR_IO_WOULD_BLOCK || sock_err == P_ERROR_IO_IN_PROGRESS)) {
		if (socket->blocking) {
			if (p_socket_io_condition_wait (socket,
							P_SOCKET_IO_CONDITION_POLLOUT,
							error) == TRUE &&
			    p_socket_check_connect_result (socket, error) == TRUE) {
				socket->connected = TRUE;
				return TRUE;
			}
		} else
			p_error_set_error_p (error,
					     (pint) sock_err,
					     err_code,
					     "Couldn't block non-blocking socket");
	} else
		p_error_set_error_p (error,
				     (pint) sock_err,
				     err_code,
				     "Failed to call connect() on socket");

	return FALSE;
}